

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

s32 __thiscall
irr::core::string<unsigned_long>::findNext(string<unsigned_long> *this,unsigned_long c,s32 startPos)

{
  int local_28;
  s32 i;
  s32 startPos_local;
  unsigned_long c_local;
  string<unsigned_long> *this_local;
  
  local_28 = startPos;
  while( true ) {
    if (this->used <= local_28) {
      return -1;
    }
    if (this->array[local_28] == c) break;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

s32 findNext(T c, s32 startPos) const
	{
		for (s32 i=startPos; i<used; ++i)
			if (array[i] == c)
				return i;

		return -1;
	}